

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::ReferenceContext::disable(ReferenceContext *this,deUint32 cap)

{
  if ((int)cap < 0x8037) {
    if ((int)cap < 0xbd0) {
      if (cap == 0xb71) {
        this->m_depthTestEnabled = false;
        return;
      }
      if (cap == 0xb90) {
        this->m_stencilTestEnabled = false;
        return;
      }
    }
    else {
      if (cap == 0xbd0) {
        return;
      }
      if (cap == 0xbe2) {
        this->m_blendEnabled = false;
        return;
      }
      if (cap == 0xc11) {
        this->m_scissorEnabled = false;
        return;
      }
    }
  }
  else if ((int)cap < 0x8d69) {
    if (cap == 0x8037) {
      this->m_polygonOffsetFillEnabled = false;
      return;
    }
    if ((cap == 0x864f) && (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0x100)) {
      this->m_depthClampEnabled = false;
      return;
    }
  }
  else if (cap == 0x8d69) {
    if (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) != 0x100) {
      this->m_primitiveRestartFixedIndex = false;
      return;
    }
  }
  else if (cap == 0x8db9) {
    if (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0x100) {
      this->m_sRGBUpdateEnabled = false;
      return;
    }
  }
  else if ((cap == 0x8f9d) && (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0x100)
          ) {
    this->m_primitiveRestartSettableIndex = false;
    return;
  }
  if (this->m_lastError != 0) {
    return;
  }
  this->m_lastError = 0x500;
  return;
}

Assistant:

void ReferenceContext::disable (deUint32 cap)
{
	switch (cap)
	{
		case GL_BLEND:					m_blendEnabled				= false;	break;
		case GL_SCISSOR_TEST:			m_scissorEnabled			= false;	break;
		case GL_DEPTH_TEST:				m_depthTestEnabled			= false;	break;
		case GL_STENCIL_TEST:			m_stencilTestEnabled		= false;	break;
		case GL_POLYGON_OFFSET_FILL:	m_polygonOffsetFillEnabled	= false;	break;

		case GL_FRAMEBUFFER_SRGB:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_sRGBUpdateEnabled = false;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_DEPTH_CLAMP:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_depthClampEnabled = false;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_DITHER:
			break;

		case GL_PRIMITIVE_RESTART_FIXED_INDEX:
			if (!glu::isContextTypeGLCore(getType()))
			{
				m_primitiveRestartFixedIndex = false;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_PRIMITIVE_RESTART:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_primitiveRestartSettableIndex = false;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		default:
			setError(GL_INVALID_ENUM);
			break;
	}
}